

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  cargo_test_t *t;
  size_t test_name_count;
  char **test_names;
  int ret;
  int start;
  int shortlist;
  int test_index;
  int quiet;
  int all;
  size_t success_count;
  size_t num_tests;
  int tests_to_run [169];
  int local_2c;
  cargo_test_t *pcStack_28;
  int was_error;
  size_t i;
  cargo_t cargo;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_2c = 0;
  success_count = 0;
  _quiet = 0;
  test_index = 0;
  shortlist = 0;
  start = 0;
  ret = 0;
  test_names._4_4_ = 1;
  test_names._0_4_ = 0;
  test_name_count = 0;
  t = (cargo_test_t *)0x0;
  cargo = (cargo_t)argv;
  argv_local._0_4_ = argc;
  memset(&num_tests,0,0x2a4);
  cargo_suppress_debug = 1;
  iVar1 = cargo_init((cargo_t *)&i,CARGO_NOERR_OUTPUT|CARGO_AUTOCLEAN,cargo->progname);
  if (iVar1 == 0) {
    cargo_set_description
              ((cargo_t)i,
               "You can add additional debug output by compiling with CARGO_DEBUG=<level>");
    uVar2 = cargo_add_option((cargo_t)i,0,"--shortlist --short -s",
                             "Only show the tests that have been run, don\'t include the entire list."
                             ,"b",&ret);
    test_names._0_4_ = uVar2 | (uint)test_names;
    uVar2 = cargo_add_option((cargo_t)i,0,"--all -a","Run all tests.","b",&test_index);
    test_names._0_4_ = uVar2 | (uint)test_names;
    uVar2 = cargo_add_option((cargo_t)i,0,"--quiet -q","Suppress CARGO_DEBUG output.","b",&shortlist
                            );
    test_names._0_4_ = uVar2 | (uint)test_names;
    uVar2 = cargo_add_option((cargo_t)i,0,"tests",
                             "Either a test number or name. If -1 is specified all tests will be run."
                             ,"[s]*",&test_name_count,&t);
    test_names._0_4_ = uVar2 | (uint)test_names;
    cargo_set_epilog((cargo_t)i,
                     "Return code for this usage message equals the number of available tests.");
    if ((uint)test_names != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x2fe5,"int main(int, char **)");
    }
    iVar1 = cargo_parse((cargo_t)i,0,1,(int)argv_local,&cargo->progname);
    if (iVar1 == 0) {
      if ((t == (cargo_test_t *)0x0) && (test_index == 0)) {
        _test_print_names();
        cargo_print_usage((cargo_t)i,CARGO_USAGE_FULL);
        fprintf(_stderr,"No test specified!\n");
        argv_local._4_4_ = 0xa9;
      }
      else {
        if (shortlist == 0) {
          cargo_suppress_debug = 0;
        }
        for (pcStack_28 = (cargo_test_t *)0x0; pcStack_28 < t;
            pcStack_28 = (cargo_test_t *)((long)&pcStack_28->name + 1)) {
          iVar1 = strncmp(*(char **)(test_name_count + (long)pcStack_28 * 8),"TEST_",5);
          if (iVar1 == 0) {
            start = _test_find_test_index(*(char **)(test_name_count + (long)pcStack_28 * 8));
            if (start < 1) {
              fprintf(_stderr,"Unknown test specified: \"%s\"\n",
                      *(undefined8 *)(test_name_count + (long)pcStack_28 * 8));
              return 0xa9;
            }
          }
          else {
            start = atoi(*(char **)(test_name_count + (long)pcStack_28 * 8));
            fprintf(_stderr,"%d\n",(ulong)(uint)start);
            if ((start == 0) || (0xa9 < start)) {
              fprintf(_stderr,"Invalid test number %s\n",
                      *(undefined8 *)(test_name_count + (long)pcStack_28 * 8));
              return 0xa9;
            }
            if (start < 0) {
              printf("Run ALL tests!\n");
              test_index = 1;
              break;
            }
          }
          tests_to_run[success_count - 2] = start;
          success_count = success_count + 1;
        }
        if (test_index != 0) {
          success_count = 0xa9;
          for (pcStack_28 = (cargo_test_t *)0x0; pcStack_28 < 0xa9;
              pcStack_28 = (cargo_test_t *)((long)pcStack_28 + 1)) {
            tests_to_run[(long)pcStack_28 - 2] = (int)pcStack_28 + 1;
          }
        }
        for (pcStack_28 = (cargo_test_t *)0x0; pcStack_28 < success_count;
            pcStack_28 = (cargo_test_t *)((long)pcStack_28 + 1)) {
          uVar2 = tests_to_run[(long)pcStack_28 - 2];
          iVar1 = uVar2 - 1;
          tests[iVar1].ran = 1;
          start = iVar1;
          fprintf(_stderr,"\n%sStart Test %3d:%s - %s\n","\x1b[22;36m",(ulong)uVar2,"\x1b[0m",
                  tests[iVar1].name);
          pcVar3 = (*tests[iVar1].f)();
          tests[iVar1].error = pcVar3;
          fprintf(_stderr,"%s","\x1b[0m");
          fprintf(_stderr,"%sEnd Test %3d:%s ","\x1b[22;36m",(ulong)(start + 1),"\x1b[0m");
          if (tests[iVar1].error == (char *)0x0) {
            fprintf(_stderr,"[%sSUCCESS%s]\n","\x1b[22;32m","\x1b[0m");
            _quiet = _quiet + 1;
          }
          else {
            fprintf(_stderr,"[%sFAIL%s] %s\n","\x1b[22;31m","\x1b[0m",tests[iVar1].error);
            local_2c = local_2c + 1;
          }
          tests[start].success = (uint)(tests[iVar1].error == (char *)0x0);
        }
        printf("---------------------------------------------------------------\n");
        printf("Test report:\n");
        printf("---------------------------------------------------------------\n");
        for (pcStack_28 = (cargo_test_t *)0x0; pcStack_28 < 0xa9;
            pcStack_28 = (cargo_test_t *)((long)pcStack_28 + 1)) {
          if (tests[(long)pcStack_28].ran == 0) {
            if (ret == 0) {
              printf(" [%sNOT RUN%s] %3lu: %s\n","\x1b[01;30m","\x1b[0m",(long)pcStack_28 + 1,
                     tests[(long)pcStack_28].name);
            }
          }
          else if (tests[(long)pcStack_28].success == 0) {
            fprintf(_stderr," [%sFAILED%s]  %3lu: %s - %s\n","\x1b[22;31m","\x1b[0m",
                    (long)pcStack_28 + 1,tests[(long)pcStack_28].name,tests[(long)pcStack_28].error)
            ;
          }
          else {
            printf(" [%sSUCCESS%s] %3lu: %s\n","\x1b[22;32m","\x1b[0m",(long)pcStack_28 + 1,
                   tests[(long)pcStack_28].name);
          }
        }
        if (local_2c == 0) {
          printf("\n[[%sSUCCESS%s]] ","\x1b[22;32m","\x1b[0m");
        }
        else {
          fprintf(_stderr,"\n[[%sFAIL%s]] ","\x1b[22;31m","\x1b[0m");
        }
        printf("%lu of %lu tests run were successful (%lu of %lu tests ran)\n",_quiet,success_count,
               success_count,0xa9);
        cargo_suppress_debug = 1;
        cargo_destroy((cargo_t *)&i);
        if (shortlist == 0) {
          cargo_suppress_debug = 0;
        }
        argv_local._4_4_ = (int)success_count - (int)_quiet;
      }
    }
    else {
      _test_print_names();
      cargo_print_usage((cargo_t)i,CARGO_USAGE_FULL);
      __stream = _stderr;
      pcVar3 = cargo_get_error((cargo_t)i);
      fprintf(__stream,"%s\n",pcVar3);
      argv_local._4_4_ = 0xa9;
    }
  }
  else {
    fprintf(_stderr,"Failed to init command line parsing\n");
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    cargo_t cargo;
    size_t i;
    int was_error = 0;
    int tests_to_run[CARGO_NUM_TESTS];
    size_t num_tests = 0;
    size_t success_count = 0;
    int all = 0;
    int quiet = 0;
    int test_index = 0;
    int shortlist = 0;
    int start = 1;
    int ret = 0;
    char **test_names = NULL;
    size_t test_name_count = 0;
    cargo_test_t *t;

    memset(tests_to_run, 0, sizeof(tests_to_run));

    cargo_suppress_debug = 1;

    if (cargo_init(&cargo, CARGO_AUTOCLEAN | CARGO_NOERR_OUTPUT, argv[0]))
    {
        fprintf(stderr, "Failed to init command line parsing\n");
        return -1;
    }

    cargo_set_description(cargo,
        "You can add additional debug output by compiling with CARGO_DEBUG=<level>");

    ret |= cargo_add_option(cargo, 0, "--shortlist --short -s",
            "Only show the tests that have been run, don't include the entire list.",
            "b", &shortlist);

    ret |= cargo_add_option(cargo, 0, "--all -a",
            "Run all tests.",
            "b", &all);

    ret |= cargo_add_option(cargo, 0, "--quiet -q",
            "Suppress CARGO_DEBUG output.",
            "b", &quiet);

    ret |= cargo_add_option(cargo, 0, "tests",
            "Either a test number or name. "
            "If -1 is specified all tests will be run.",
            "[s]*", &test_names, &test_name_count);

    cargo_set_epilog(cargo,
            "Return code for this usage message equals "
            "the number of available tests.");

    assert(ret == 0);

    if (cargo_parse(cargo, 0, 1, argc, argv))
    {
        _test_print_names();
        cargo_print_usage(cargo, 0);
        fprintf(stderr, "%s\n", cargo_get_error(cargo));
        return CARGO_NUM_TESTS;
    }

    if ((test_name_count == 0) && !all)
    {
        _test_print_names();
        cargo_print_usage(cargo, 0);
        fprintf(stderr, "No test specified!\n");
        return CARGO_NUM_TESTS;
    }

    if (!quiet) cargo_suppress_debug = 0;

    for (i = 0; i < test_name_count; i++)
    {
        // First check if we were given a function name.
        if (!strncmp(test_names[i], "TEST_", 5))
        {
            test_index = _test_find_test_index(test_names[i]);

            if (test_index <= 0)
            {
                fprintf(stderr, "Unknown test specified: \"%s\"\n", test_names[i]);
                return CARGO_NUM_TESTS;
            }
        }
        else
        {
            test_index = atoi(test_names[i]);
            fprintf(stderr, "%d\n", test_index);

            if ((test_index == 0) || (test_index > (int)CARGO_NUM_TESTS))
            {
                fprintf(stderr, "Invalid test number %s\n", test_names[i]);
                return CARGO_NUM_TESTS;
            }
            else if (test_index < 0)
            {
                printf("Run ALL tests!\n");
                all = 1;
                break;
            }
        }

        tests_to_run[num_tests] = test_index;
        num_tests++;
    }

    // Run all tests.
    if (all)
    {
        num_tests = CARGO_NUM_TESTS;

        for (i = 0; i < num_tests; i++)
        {
            tests_to_run[i] = i + 1;
        }
    }

    // Run the tests.
    for (i = 0; i < num_tests; i++)
    {
        test_index = tests_to_run[i] - 1;
        t = &tests[test_index];
        t->ran = 1;

        fprintf(stderr, "\n%sStart Test %3d:%s - %s\n",
            CARGO_COLOR_CYAN, test_index + 1, CARGO_COLOR_RESET, t->name);

        //fprintf(stderr, "%s", CARGO_COLOR_DARK_GRAY);
        t->error = t->f();
        fprintf(stderr, "%s", CARGO_COLOR_RESET);

        fprintf(stderr, "%sEnd Test %3d:%s ",
            CARGO_COLOR_CYAN, test_index + 1, CARGO_COLOR_RESET);

        if (t->error)
        {
            fprintf(stderr, "[%sFAIL%s] %s\n",
                CARGO_COLOR_RED, CARGO_COLOR_RESET, t->error);
            was_error++;
        }
        else
        {
            fprintf(stderr, "[%sSUCCESS%s]\n",
                CARGO_COLOR_GREEN, CARGO_COLOR_RESET);

            success_count++;
        }

        tests[test_index].success = (t->error == NULL);
    }

    printf("---------------------------------------------------------------\n");
    printf("Test report:\n");
    printf("---------------------------------------------------------------\n");

    for (i = 0; i < CARGO_NUM_TESTS; i++)
    {
        if (!tests[i].ran)
        {
            if (!shortlist)
            {
                printf(" [%sNOT RUN%s] %3lu: %s\n",
                    CARGO_COLOR_DARK_GRAY, CARGO_COLOR_RESET, (i + 1), tests[i].name);
            }

            continue;
        }

        if (tests[i].success)
        {
            printf(" [%sSUCCESS%s] %3lu: %s\n",
                CARGO_COLOR_GREEN, CARGO_COLOR_RESET, (i + 1), tests[i].name);
        }
        else
        {
            fprintf(stderr, " [%sFAILED%s]  %3lu: %s - %s\n",
                CARGO_COLOR_RED, CARGO_COLOR_RESET,
                (i + 1), tests[i].name, tests[i].error);
        }
    }

    if (was_error)
    {
        fprintf(stderr, "\n[[%sFAIL%s]] ", CARGO_COLOR_RED, CARGO_COLOR_RESET);
    }
    else
    {
        printf("\n[[%sSUCCESS%s]] ", CARGO_COLOR_GREEN, CARGO_COLOR_RESET);
    }

    printf("%lu of %lu tests run were successful (%lu of %lu tests ran)\n",
            success_count, num_tests, num_tests, CARGO_NUM_TESTS);

    cargo_suppress_debug = 1;
    cargo_destroy(&cargo);
    if (!quiet) cargo_suppress_debug = 0;

    return (num_tests - success_count);
}